

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# default_value_objectwriter.cc
# Opt level: O2

DataPiece *
google::protobuf::util::converter::DefaultValueObjectWriter::CreateDefaultDataPieceForField
          (DataPiece *__return_storage_ptr__,Field *field,TypeInfo *typeinfo,bool use_ints_for_enums
          )

{
  uint *puVar1;
  double *pdVar2;
  float *pfVar3;
  unsigned_long *puVar4;
  bool *pbVar5;
  undefined1 uVar6;
  unsigned_long uVar7;
  uint uVar8;
  float fVar9;
  StringPiece local_110;
  StringPiece local_100;
  StringPiece local_f0;
  StringPiece local_e0;
  StringPiece local_d0;
  StringPiece local_c0;
  StringPiece local_b0;
  StringPiece local_a0;
  StringPiece local_90;
  DataPiece local_80;
  float local_58;
  undefined4 uStack_54;
  undefined1 local_50 [8];
  StatusOr<long> result;
  
  switch(field->kind_) {
  case 1:
    StringPiece::StringPiece<std::allocator<char>>(&local_f0,(field->default_value_).ptr_);
    if (local_f0.length_ == 0) {
      local_58 = 0.0;
      uStack_54 = 0;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_f0.ptr_;
      local_80.field_2.str_.size_ = local_f0.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToDouble((StatusOr<double> *)local_50,&local_80);
      local_58 = 0.0;
      uStack_54 = 0;
      if (local_50._0_4_ == OK) {
        pdVar2 = StatusOr<double>::value((StatusOr<double> *)local_50);
        local_58 = SUB84(*pdVar2,0);
        uStack_54 = (undefined4)((ulong)*pdVar2 >> 0x20);
      }
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_DOUBLE;
    (__return_storage_ptr__->field_2).i64_ = CONCAT44(uStack_54,local_58);
    break;
  case 2:
    StringPiece::StringPiece<std::allocator<char>>(&local_e0,(field->default_value_).ptr_);
    if (local_e0.length_ == 0) {
      local_58 = 0.0;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_e0.ptr_;
      local_80.field_2.str_.size_ = local_e0.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToFloat((StatusOr<float> *)local_50,&local_80);
      fVar9 = 0.0;
      if (local_50._0_4_ == OK) {
        pfVar3 = StatusOr<float>::value((StatusOr<float> *)local_50);
        fVar9 = *pfVar3;
      }
      _local_58 = CONCAT44(uStack_54,fVar9);
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_FLOAT;
    (__return_storage_ptr__->field_2).i32_ = (int32)local_58;
    break;
  case 3:
  case 0x10:
  case 0x12:
    StringPiece::StringPiece<std::allocator<char>>(&local_d0,(field->default_value_).ptr_);
    if (local_d0.length_ == 0) {
      uVar7 = 0;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_d0.ptr_;
      local_80.field_2.str_.size_ = local_d0.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToInt64((StatusOr<long> *)local_50,&local_80);
      if (local_50._0_4_ == OK) {
        puVar4 = (unsigned_long *)StatusOr<long>::value((StatusOr<long> *)local_50);
        uVar7 = *puVar4;
      }
      else {
        uVar7 = 0;
      }
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_INT64;
    goto LAB_00329348;
  case 4:
  case 6:
    StringPiece::StringPiece<std::allocator<char>>(&local_c0,(field->default_value_).ptr_);
    if (local_c0.length_ == 0) {
      uVar7 = 0;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_c0.ptr_;
      local_80.field_2.str_.size_ = local_c0.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToUint64((StatusOr<unsigned_long> *)local_50,&local_80);
      if (local_50._0_4_ == OK) {
        puVar4 = StatusOr<unsigned_long>::value((StatusOr<unsigned_long> *)local_50);
        uVar7 = *puVar4;
      }
      else {
        uVar7 = 0;
      }
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_UINT64;
LAB_00329348:
    (__return_storage_ptr__->field_2).i64_ = uVar7;
    break;
  case 5:
  case 0xf:
  case 0x11:
    StringPiece::StringPiece<std::allocator<char>>(&local_b0,(field->default_value_).ptr_);
    if (local_b0.length_ == 0) {
      uVar8 = 0;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_b0.ptr_;
      local_80.field_2.str_.size_ = local_b0.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToInt32((StatusOr<int> *)local_50,&local_80);
      uVar8 = 0;
      if (local_50._0_4_ == OK) {
        puVar1 = (uint *)StatusOr<int>::value((StatusOr<int> *)local_50);
        uVar8 = *puVar1;
      }
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_INT32;
    goto LAB_003292e7;
  case 7:
  case 0xd:
    StringPiece::StringPiece<std::allocator<char>>(&local_90,(field->default_value_).ptr_);
    if (local_90.length_ == 0) {
      uVar8 = 0;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_90.ptr_;
      local_80.field_2.str_.size_ = local_90.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToUint32((StatusOr<unsigned_int> *)local_50,&local_80);
      uVar8 = 0;
      if (local_50._0_4_ == OK) {
        puVar1 = StatusOr<unsigned_int>::value((StatusOr<unsigned_int> *)local_50);
        uVar8 = *puVar1;
      }
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_UINT32;
LAB_003292e7:
    (__return_storage_ptr__->field_2).i32_ = uVar8;
    break;
  case 8:
    StringPiece::StringPiece<std::allocator<char>>(&local_a0,(field->default_value_).ptr_);
    if (local_a0.length_ == 0) {
      uVar6 = false;
    }
    else {
      local_80._vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
      local_80.type_ = TYPE_STRING;
      local_80.field_2.i64_ = (int64)local_a0.ptr_;
      local_80.field_2.str_.size_ = local_a0.length_;
      local_80.use_strict_base64_decoding_ = true;
      DataPiece::ToBool((StatusOr<bool> *)local_50,&local_80);
      if (local_50._0_4_ == OK) {
        pbVar5 = StatusOr<bool>::value((StatusOr<bool> *)local_50);
        uVar6 = *pbVar5;
      }
      else {
        uVar6 = 0;
      }
      std::__cxx11::string::~string((string *)&result);
    }
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_BOOL;
    (__return_storage_ptr__->field_2).bool_ = (bool)uVar6;
    break;
  case 9:
    StringPiece::StringPiece<std::allocator<char>>(&local_110,(field->default_value_).ptr_);
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_STRING;
    local_100.ptr_._0_4_ = (int32)local_110.ptr_;
    local_100.ptr_._4_4_ = local_110.ptr_._4_4_;
    local_100.length_._0_4_ = (undefined4)local_110.length_;
    local_100.length_._4_4_ = local_110.length_._4_4_;
    goto LAB_00329297;
  default:
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_NULL;
    (__return_storage_ptr__->field_2).i32_ = 0;
    break;
  case 0xc:
    StringPiece::StringPiece<std::allocator<char>>(&local_100,(field->default_value_).ptr_);
    __return_storage_ptr__->_vptr_DataPiece = (_func_int **)&PTR__DataPiece_003e3c20;
    __return_storage_ptr__->type_ = TYPE_BYTES;
LAB_00329297:
    (__return_storage_ptr__->field_2).i32_ = (int32)local_100.ptr_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 4) = local_100.ptr_._4_4_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 8) = (undefined4)local_100.length_;
    *(undefined4 *)((long)&__return_storage_ptr__->field_2 + 0xc) = local_100.length_._4_4_;
    __return_storage_ptr__->use_strict_base64_decoding_ = true;
    return __return_storage_ptr__;
  case 0xe:
    FindEnumDefault(__return_storage_ptr__,field,typeinfo,use_ints_for_enums);
    return __return_storage_ptr__;
  }
  __return_storage_ptr__->use_strict_base64_decoding_ = false;
  return __return_storage_ptr__;
}

Assistant:

DataPiece DefaultValueObjectWriter::CreateDefaultDataPieceForField(
    const google::protobuf::Field& field, const TypeInfo* typeinfo,
    bool use_ints_for_enums) {
  switch (field.kind()) {
    case google::protobuf::Field::TYPE_DOUBLE: {
      return DataPiece(ConvertTo<double>(
          field.default_value(), &DataPiece::ToDouble, static_cast<double>(0)));
    }
    case google::protobuf::Field::TYPE_FLOAT: {
      return DataPiece(ConvertTo<float>(
          field.default_value(), &DataPiece::ToFloat, static_cast<float>(0)));
    }
    case google::protobuf::Field::TYPE_INT64:
    case google::protobuf::Field::TYPE_SINT64:
    case google::protobuf::Field::TYPE_SFIXED64: {
      return DataPiece(ConvertTo<int64>(
          field.default_value(), &DataPiece::ToInt64, static_cast<int64>(0)));
    }
    case google::protobuf::Field::TYPE_UINT64:
    case google::protobuf::Field::TYPE_FIXED64: {
      return DataPiece(ConvertTo<uint64>(
          field.default_value(), &DataPiece::ToUint64, static_cast<uint64>(0)));
    }
    case google::protobuf::Field::TYPE_INT32:
    case google::protobuf::Field::TYPE_SINT32:
    case google::protobuf::Field::TYPE_SFIXED32: {
      return DataPiece(ConvertTo<int32>(
          field.default_value(), &DataPiece::ToInt32, static_cast<int32>(0)));
    }
    case google::protobuf::Field::TYPE_BOOL: {
      return DataPiece(
          ConvertTo<bool>(field.default_value(), &DataPiece::ToBool, false));
    }
    case google::protobuf::Field::TYPE_STRING: {
      return DataPiece(field.default_value(), true);
    }
    case google::protobuf::Field::TYPE_BYTES: {
      return DataPiece(field.default_value(), false, true);
    }
    case google::protobuf::Field::TYPE_UINT32:
    case google::protobuf::Field::TYPE_FIXED32: {
      return DataPiece(ConvertTo<uint32>(
          field.default_value(), &DataPiece::ToUint32, static_cast<uint32>(0)));
    }
    case google::protobuf::Field::TYPE_ENUM: {
      return FindEnumDefault(field, typeinfo, use_ints_for_enums);
    }
    default: {
      return DataPiece::NullData();
    }
  }
}